

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O1

bool cmQtAutoMocUic(string_view infoFile,string_view config)

{
  bool bVar1;
  cmQtAutoMocUicT local_940;
  
  cmQtAutoGenerator::cmQtAutoGenerator(&local_940.super_cmQtAutoGenerator,GEN);
  local_940.super_cmQtAutoGenerator._vptr_cmQtAutoGenerator =
       (_func_int **)&PTR__cmQtAutoMocUicT_00887e30;
  local_940.BaseConst_.MultiConfig = false;
  local_940.BaseConst_.QtVersion.Major = 4;
  local_940.BaseConst_.QtVersion.Minor = 0;
  local_940.BaseConst_.ThreadCount = 0;
  local_940.BaseConst_.AutogenBuildDir._M_dataplus._M_p =
       (pointer)&local_940.BaseConst_.AutogenBuildDir.field_2;
  local_940.BaseConst_.AutogenBuildDir._M_string_length = 0;
  local_940.BaseConst_.AutogenBuildDir.field_2._M_local_buf[0] = '\0';
  local_940.BaseConst_.AutogenIncludeDir._M_dataplus._M_p =
       (pointer)&local_940.BaseConst_.AutogenIncludeDir.field_2;
  local_940.BaseConst_.AutogenIncludeDir._M_string_length = 0;
  local_940.BaseConst_.AutogenIncludeDir.field_2._M_local_buf[0] = '\0';
  local_940.BaseConst_.CMakeExecutable._M_dataplus._M_p =
       (pointer)&local_940.BaseConst_.CMakeExecutable.field_2;
  local_940.BaseConst_.CMakeExecutable._M_string_length = 0;
  local_940.BaseConst_.CMakeExecutable.field_2._M_local_buf[0] = '\0';
  local_940.BaseConst_.CMakeExecutableTime.Time = 0;
  local_940.BaseConst_.ParseCacheFile._M_dataplus._M_p =
       (pointer)&local_940.BaseConst_.ParseCacheFile.field_2;
  local_940.BaseConst_.ParseCacheFile._M_string_length = 0;
  local_940.BaseConst_.ParseCacheFile.field_2._M_local_buf[0] = '\0';
  local_940.BaseConst_.DepFile._M_dataplus._M_p = (pointer)&local_940.BaseConst_.DepFile.field_2;
  local_940.BaseConst_.DepFile._M_string_length = 0;
  local_940.BaseConst_.DepFile.field_2._M_local_buf[0] = '\0';
  local_940.BaseConst_.DepFileRuleName._M_dataplus._M_p =
       (pointer)&local_940.BaseConst_.DepFileRuleName.field_2;
  local_940.BaseConst_.DepFileRuleName._M_string_length = 0;
  local_940.BaseConst_.DepFileRuleName.field_2._M_local_buf[0] = '\0';
  local_940.BaseEval_.ParseCacheTime.Time = 0;
  local_940.BaseEval_.ParseCache.Map_._M_h._M_buckets =
       &local_940.BaseEval_.ParseCache.Map_._M_h._M_single_bucket;
  local_940.BaseEval_.ParseCacheChanged._M_base._M_i = (__atomic_base<bool>)false;
  local_940.BaseConst_.ListFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_940.BaseConst_.ListFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_940.BaseConst_.HeaderExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_940.BaseConst_.ListFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_940.BaseConst_.HeaderExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_940.BaseConst_.HeaderExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_940.BaseEval_.ParseCache.Map_._M_h._M_bucket_count = 1;
  local_940.BaseEval_.ParseCache.Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_940.BaseEval_.ParseCache.Map_._M_h._M_element_count = 0;
  local_940.BaseEval_.ParseCache.Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_940.BaseEval_.ParseCache.Map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_940.BaseEval_.ParseCache.Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_940.BaseEval_.Headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_940.BaseEval_.Headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_940.BaseEval_.Headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_940.BaseEval_.Headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_940.BaseEval_.Headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_940.BaseEval_.Sources._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_940.BaseEval_.Sources._M_t._M_impl.super__Rb_tree_header._M_header;
  local_940.BaseEval_.Sources._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_940.BaseEval_.Sources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_940.MocConst_.ExecutableTime.Time = 0;
  local_940.MocConst_.Executable._M_dataplus._M_p = (pointer)&local_940.MocConst_.Executable.field_2
  ;
  local_940.MocConst_.Enabled = false;
  local_940.MocConst_.SettingsChanged = false;
  local_940.MocConst_.RelaxedMode = false;
  local_940.MocConst_.PathPrefix = false;
  local_940.MocConst_.CanOutputDependencies = false;
  local_940.BaseEval_.Sources._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
  local_940.BaseEval_.Sources._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
  local_940.MocConst_.Executable._M_string_length = 0;
  local_940.MocConst_.Executable.field_2._M_local_buf[0] = '\0';
  local_940.MocConst_.CompFileAbs._M_dataplus._M_p =
       (pointer)&local_940.MocConst_.CompFileAbs.field_2;
  local_940.MocConst_.CompFileAbs._M_string_length = 0;
  local_940.MocConst_.CompFileAbs.field_2._M_local_buf[0] = '\0';
  local_940.MocConst_.PredefsFileAbs._M_dataplus._M_p =
       (pointer)&local_940.MocConst_.PredefsFileAbs.field_2;
  local_940.MocConst_.PredefsFileAbs._M_string_length = 0;
  local_940.MocConst_.PredefsFileAbs.field_2._M_local_buf[0] = '\0';
  local_940.MocConst_.SkipList._M_h._M_buckets = &local_940.MocConst_.SkipList._M_h._M_single_bucket
  ;
  local_940.MocConst_.SkipList._M_h._M_bucket_count = 1;
  local_940.MocConst_.SkipList._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_940.MocConst_.SkipList._M_h._M_element_count = 0;
  local_940.MocConst_.SkipList._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_940.MocConst_.RegExpInclude.regmust = (char *)0x0;
  local_940.MocConst_.RegExpInclude.program = (char *)0x0;
  local_940.MocConst_.RegExpInclude.progsize = 0;
  local_940.BaseEval_.Headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_940.BaseEval_.Headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_940.BaseEval_.Sources._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_940.BaseEval_.Sources._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memset(&local_940.MocConst_.SkipList._M_h._M_rehash_policy._M_next_resize,0,0x17a);
  cmsys::RegularExpression::compile
            (&local_940.MocConst_.RegExpInclude,
             "(^|\n)[ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]"
            );
  local_940.MocEval_.HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_940.MocEval_.HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_940.MocEval_.PredefsTime.Time = 0;
  local_940.MocEval_.HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_940.MocEval_.HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_940.MocEval_.HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_940.MocEval_.SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_940.MocEval_.SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_940.MocEval_.SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_940.MocEval_.SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_940.MocEval_.SourceMappings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_940.MocEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_940.MocEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header;
  local_940.MocEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_940.MocEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_940.MocEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_940.MocEval_.HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_940.MocEval_.HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header;
  local_940.MocEval_.HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_940.MocEval_.HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_940.MocEval_.HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_940.MocEval_.OutputDirs._M_h._M_buckets =
       &local_940.MocEval_.OutputDirs._M_h._M_single_bucket;
  local_940.MocEval_.OutputDirs._M_h._M_bucket_count = 1;
  local_940.MocEval_.OutputDirs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_940.MocEval_.OutputDirs._M_h._M_element_count = 0;
  local_940.MocEval_.OutputDirs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_940.MocEval_.CompUpdated = false;
  local_940.MocEval_.OutputDirs._M_h._M_rehash_policy._M_next_resize = 0;
  local_940.MocEval_.OutputDirs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_940.UicConst_.ExecutableTime.Time = 0;
  local_940.UicConst_.Executable._M_dataplus._M_p = (pointer)&local_940.UicConst_.Executable.field_2
  ;
  local_940.MocEval_.CompFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_940._1578_8_ = 0;
  local_940.MocEval_.CompFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_940.MocEval_.CompFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_940.MocEval_.CompFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_940.UicConst_.Executable._M_string_length = 0;
  local_940.UicConst_.Executable.field_2._M_local_buf[0] = '\0';
  local_940.UicConst_.SkipList._M_h._M_buckets = &local_940.UicConst_.SkipList._M_h._M_single_bucket
  ;
  local_940.UicConst_.SkipList._M_h._M_bucket_count = 1;
  local_940.UicConst_.SkipList._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_940.UicConst_.SkipList._M_h._M_element_count = 0;
  local_940.UicConst_.SkipList._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_940.UicConst_.UiFiles._M_h._M_buckets = &local_940.UicConst_.UiFiles._M_h._M_single_bucket;
  local_940.UicConst_.SkipList._M_h._M_rehash_policy._M_next_resize = 0;
  local_940.UicConst_.SkipList._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_940.UicConst_.Options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_940.UicConst_.Options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_940.UicConst_.Options.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_940.UicConst_.UiFiles._M_h._M_bucket_count = 1;
  local_940.UicConst_.UiFiles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_940.UicConst_.UiFiles._M_h._M_element_count = 0;
  local_940.UicConst_.UiFiles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_940.UicConst_.RegExpInclude.regmust = (char *)0x0;
  local_940.UicConst_.RegExpInclude.program = (char *)0x0;
  local_940.UicConst_.RegExpInclude.progsize = 0;
  local_940.MocEval_.HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_940.MocEval_.HeaderMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_940.MocEval_.SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_940.MocEval_.SourceMappings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_940.MocEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_940.MocEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_940.MocEval_.HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_940.MocEval_.HeadersDiscovered._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memset(&local_940.UicConst_.UiFiles._M_h._M_rehash_policy._M_next_resize,0,0xd2);
  cmsys::RegularExpression::compile
            (&local_940.UicConst_.RegExpInclude,
             "(^|\n)[ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?ui_[^ \">/]+\\.h)[\">]");
  local_940.UicEval_.UiFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_940.UicEval_.UiFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  local_940.UicEval_.UiFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_940.UicEval_.UiFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_940.UicEval_.UiFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_940.UicEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_940.UicEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header;
  local_940.UicEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_940.UicEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_940.UicEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_940.UicEval_.OutputDirs._M_h._M_buckets =
       &local_940.UicEval_.OutputDirs._M_h._M_single_bucket;
  local_940.UicEval_.OutputDirs._M_h._M_bucket_count = 1;
  local_940.UicEval_.OutputDirs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_940.UicEval_.OutputDirs._M_h._M_element_count = 0;
  local_940.UicEval_.OutputDirs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_940.UicEval_.OutputDirs._M_h._M_rehash_policy._M_next_resize = 0;
  local_940.UicEval_.OutputDirs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_940.SettingsFile_._M_dataplus._M_p = (pointer)&local_940.SettingsFile_.field_2;
  local_940.SettingsFile_._M_string_length = 0;
  local_940.SettingsFile_.field_2._M_local_buf[0] = '\0';
  local_940.SettingsStringMoc_._M_dataplus._M_p = (pointer)&local_940.SettingsStringMoc_.field_2;
  local_940.SettingsStringMoc_._M_string_length = 0;
  local_940.SettingsStringMoc_.field_2._M_local_buf[0] = '\0';
  local_940.SettingsStringUic_._M_dataplus._M_p = (pointer)&local_940.SettingsStringUic_.field_2;
  local_940.SettingsStringUic_._M_string_length = 0;
  local_940.SettingsStringUic_.field_2._M_local_buf[0] = '\0';
  local_940.JobError_._M_base._M_i = (__atomic_base<bool>)false;
  local_940.UicEval_.UiFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_940.UicEval_.UiFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_940.UicEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_940.UicEval_.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cmWorkerPool::cmWorkerPool(&local_940.WorkerPool_);
  local_940.CMakeLibMutex_.super___mutex_base._M_mutex._16_8_ = 0;
  local_940.CMakeLibMutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_940.CMakeLibMutex_.super___mutex_base._M_mutex.__align = 0;
  local_940.CMakeLibMutex_.super___mutex_base._M_mutex._8_8_ = 0;
  local_940.CMakeLibMutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  bVar1 = cmQtAutoGenerator::Run(&local_940.super_cmQtAutoGenerator,infoFile,config);
  anon_unknown.dwarf_3092e0::cmQtAutoMocUicT::~cmQtAutoMocUicT(&local_940);
  return bVar1;
}

Assistant:

bool cmQtAutoMocUic(cm::string_view infoFile, cm::string_view config)
{
  return cmQtAutoMocUicT().Run(infoFile, config);
}